

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getNextLeak
          (MemoryLeakDetectorTable *this,MemoryLeakDetectorNode *leak,MemLeakPeriod period)

{
  ulong uVar1;
  MemoryLeakDetectorNode *pMVar2;
  MemoryLeakDetectorList *this_00;
  ulong uVar3;
  
  pMVar2 = MemoryLeakDetectorList::getNextLeak(this->table_,leak,period);
  if (pMVar2 == (MemoryLeakDetectorNode *)0x0) {
    uVar1 = *(ulong *)(leak + 0x10);
    uVar3 = ~((uVar1 / 0x49) * 0x49) + uVar1;
    this_00 = this[-(uVar1 / 0x49)].table_ + uVar1;
    do {
      this_00 = this_00 + 1;
      uVar3 = uVar3 + 1;
      if (0x47 < uVar3) {
        return (MemoryLeakDetectorNode *)0x0;
      }
      pMVar2 = MemoryLeakDetectorList::getFirstLeak(this_00,period);
    } while (pMVar2 == (MemoryLeakDetectorNode *)0x0);
  }
  return pMVar2;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getNextLeak(MemoryLeakDetectorNode* leak, MemLeakPeriod period)
{
    unsigned long i = hash(leak->memory_);
    MemoryLeakDetectorNode* node = table_[i].getNextLeak(leak, period);
    if (node) return node;

    for (++i; i < hash_prime; i++) {
        node = table_[i].getFirstLeak(period);
        if (node) return node;
    }
    return NULLPTR;
}